

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-parser.cc
# Opt level: O1

Result __thiscall wabt::WastParser::ParseEndLabelOpt(WastParser *this,string *begin_label)

{
  anon_union_16_2_ecfd7102_for_Location_1 *paVar1;
  char *__n;
  Location loc_00;
  undefined8 uVar2;
  size_t sVar3;
  char *pcVar4;
  undefined7 uVar5;
  Result RVar6;
  int iVar7;
  Enum EVar8;
  undefined8 in_R8;
  undefined8 in_R9;
  Location loc;
  string end_label;
  undefined4 uStack_80;
  undefined4 uStack_7c;
  undefined4 local_78;
  undefined4 uStack_74;
  undefined4 uStack_70;
  undefined4 uStack_6c;
  Token local_60;
  
  GetToken(&local_60,this);
  uVar5 = local_60.loc.field_1.field_1.offset._1_7_;
  pcVar4 = local_60.loc.filename._M_str;
  sVar3 = local_60.loc.filename._M_len;
  uVar2 = CONCAT71(local_60.loc.field_1.field_1.offset._1_7_,local_60.loc.field_1.field2[0]);
  paVar1 = &local_60.loc.field_1;
  local_60.loc.filename._M_str = (char *)0x0;
  local_60.loc.field_1.field2[0] = 0;
  local_60.loc.filename._M_len = (size_t)paVar1;
  RVar6 = ParseLabelOpt(this,(string *)&local_60);
  EVar8 = Error;
  if (RVar6.enum_ != Error) {
    EVar8 = Ok;
    if (local_60.loc.filename._M_str != (char *)0x0) {
      __n = (char *)begin_label->_M_string_length;
      uStack_80 = SUB84(pcVar4,0);
      uStack_7c = (undefined4)((ulong)pcVar4 >> 0x20);
      local_78 = (undefined4)uVar2;
      uStack_74 = (undefined4)((uint7)uVar5 >> 0x18);
      uStack_70 = (undefined4)local_60.loc.field_1._8_8_;
      uStack_6c = (undefined4)((ulong)local_60.loc.field_1._8_8_ >> 0x20);
      if (__n == (char *)0x0) {
        EVar8 = Ok;
        Error(this,0x16951b,(char *)local_60.loc.filename._M_len);
      }
      else {
        if (__n == local_60.loc.filename._M_str) {
          iVar7 = bcmp((begin_label->_M_dataplus)._M_p,(void *)local_60.loc.filename._M_len,
                       (size_t)__n);
          EVar8 = Ok;
          if (iVar7 == 0) goto LAB_00138d68;
        }
        EVar8 = Ok;
        loc_00.filename._M_str._0_4_ = uStack_80;
        loc_00.filename._M_len = sVar3;
        loc_00.filename._M_str._4_4_ = uStack_7c;
        loc_00.field_1.field_0.line = local_78;
        loc_00.field_1.field_0.first_column = uStack_74;
        loc_00.field_1.field_0.last_column = uStack_70;
        loc_00.field_1._12_4_ = uStack_6c;
        Error(this,loc_00,"mismatching label \"%s\" != \"%s\"",(begin_label->_M_dataplus)._M_p,
              local_60.loc.filename._M_len,in_R8,in_R9);
      }
    }
  }
LAB_00138d68:
  if ((anon_union_16_2_ecfd7102_for_Location_1 *)local_60.loc.filename._M_len != paVar1) {
    operator_delete((void *)local_60.loc.filename._M_len,
                    CONCAT71(local_60.loc.field_1.field_1.offset._1_7_,
                             local_60.loc.field_1.field2[0]) + 1);
  }
  return (Result)EVar8;
}

Assistant:

Result WastParser::ParseEndLabelOpt(const std::string& begin_label) {
  WABT_TRACE(ParseEndLabelOpt);
  Location loc = GetLocation();
  std::string end_label;
  CHECK_RESULT(ParseLabelOpt(&end_label));
  if (!end_label.empty()) {
    if (begin_label.empty()) {
      Error(loc, "unexpected label \"%s\"", end_label.c_str());
    } else if (begin_label != end_label) {
      Error(loc, "mismatching label \"%s\" != \"%s\"", begin_label.c_str(),
            end_label.c_str());
    }
  }
  return Result::Ok;
}